

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O2

int __thiscall soplex::NameSet::remove(NameSet *this,char *__filename)

{
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this_00;
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  DataKey *__filename_00;
  Name nam;
  Name local_28;
  
  this_00 = &this->hashtab;
  local_28.name = __filename;
  bVar1 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::has(this_00,&local_28);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    __filename_00 = DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::get(this_00,&local_28);
    DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::remove(this_00,(char *)&local_28);
    iVar2 = DataSet<int>::remove(&this->set,(char *)__filename_00);
  }
  return iVar2;
}

Assistant:

void NameSet::remove(const char* str)
{
   const Name nam(str);

   if(hashtab.has(nam))
   {
      const DataKey* hkey = hashtab.get(nam);
      assert(hkey != nullptr);
      hashtab.remove(nam);
      set.remove(*hkey);
   }
}